

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool HasMatchingArgumentNames
               (ArrayView<ArgumentData> *functionArguments,ArrayView<ArgumentData> arguments)

{
  SynIdentifier *pSVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  InplaceStr functionArgumentName;
  InplaceStr argumentName;
  bool local_69;
  InplaceStr local_58;
  InplaceStr local_48;
  
  local_69 = arguments.count == 0;
  if (!local_69) {
    uVar4 = arguments._8_8_ & 0xffffffff;
    uVar6 = 0;
    do {
      pSVar1 = arguments.data[uVar6].name;
      if (pSVar1 != (SynIdentifier *)0x0) {
        local_48.begin = (pSVar1->name).begin;
        local_48.end = (pSVar1->name).end;
        if (functionArguments->count == 0) {
          return local_69;
        }
        lVar5 = 0x10;
        uVar7 = 0;
        do {
          if (*(long *)((long)&functionArguments->data->source + lVar5) != 0) {
            lVar2 = *(long *)((long)&functionArguments->data->source + lVar5);
            local_58.begin = *(char **)(lVar2 + 0x40);
            local_58.end = *(char **)(lVar2 + 0x48);
            bVar3 = InplaceStr::operator==(&local_58,&local_48);
            if (bVar3) {
              bVar3 = true;
              break;
            }
          }
          bVar3 = false;
          uVar7 = uVar7 + 1;
          lVar5 = lVar5 + 0x30;
        } while (uVar7 < functionArguments->count);
        if (!bVar3) {
          return local_69;
        }
      }
      uVar6 = uVar6 + 1;
      local_69 = uVar4 <= uVar6;
    } while (uVar6 != uVar4);
  }
  return local_69;
}

Assistant:

bool HasMatchingArgumentNames(ArrayView<ArgumentData> &functionArguments, ArrayView<ArgumentData> arguments)
{
	for(unsigned i = 0, e = arguments.count; i < e; i++)
	{
		if(!arguments.data[i].name)
			continue;

		InplaceStr argumentName = arguments.data[i].name->name;

		bool found = false;

		for(unsigned k = 0; k < functionArguments.count; k++)
		{
			if(!functionArguments.data[k].name)
				continue;

			InplaceStr functionArgumentName = functionArguments.data[k].name->name;

			if(functionArgumentName == argumentName)
			{
				found = true;
				break;
			}
		}

		if(!found)
			return false;
	}

	return true;
}